

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O3

FT_Error sdf_generate_with_overlaps
                   (SDF_Params internal_params,SDF_Shape *shape,FT_UInt spread,FT_Bitmap *bitmap)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  SDF_Edge_Type SVar4;
  SDF_Contour *pSVar5;
  undefined8 uVar6;
  SDF_Contour_ *pSVar7;
  FT_Memory memory;
  FT_Pointer pvVar8;
  uint uVar9;
  FT_Error FVar10;
  FT_Pointer pvVar11;
  FT_Pointer pvVar12;
  SDF_Edge *pSVar13;
  SDF_Contour *pSVar14;
  undefined4 uVar15;
  undefined4 in_register_0000000c;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long *plVar20;
  undefined8 *puVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  byte bVar26;
  byte bVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  byte bVar31;
  byte bVar32;
  SDF_Contour_ **ppSVar33;
  SDF_Params internal_params_00;
  FT_Error error;
  SDF_Shape temp_shape;
  FT_Error local_a8;
  FT_UInt local_a4;
  FT_Memory local_a0;
  ulong local_98;
  FT_Pointer local_90;
  FT_Orientation local_84;
  uint *local_80;
  ulong local_78;
  SDF_Contour_ **local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  SDF_Contour *local_50;
  FT_Bitmap *local_48;
  SDF_Shape local_40;
  
  local_80 = (uint *)CONCAT44(in_register_0000000c,spread);
  puVar21 = (undefined8 *)
            CONCAT44((int)((ulong)register0x00000030 >> 0x20),internal_params.overload_sign);
  uVar24 = internal_params._0_8_;
  local_a8 = 0;
  FVar10 = 6;
  if ((local_80 != (uint *)0x0 && puVar21 != (undefined8 *)0x0) &&
     (local_a0 = (FT_Memory)*puVar21, local_a0 != (FT_Memory)0x0)) {
    lVar25 = puVar21[1];
    local_a4 = (FT_UInt)shape;
    if (lVar25 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar9 = uVar9 + 1;
        lVar25 = *(long *)(lVar25 + 0x18);
      } while (lVar25 != 0);
    }
    local_78 = (ulong)*local_80;
    uVar2 = local_80[1];
    uVar30 = (ulong)uVar9;
    local_58 = uVar30 * 0x28;
    local_40.memory = local_a0;
    local_90 = ft_mem_alloc(local_a0,local_58,&local_a8);
    if (local_a8 == 0) {
      pvVar11 = ft_mem_alloc(local_a0,uVar30 * 4,&local_a8);
      if (local_a8 == 0) {
        ppSVar33 = (SDF_Contour_ **)(puVar21 + 1);
        local_70 = ppSVar33;
        if (uVar30 == 0) {
          pSVar14 = (SDF_Contour *)0x0;
        }
        else {
          local_68 = uVar24 & 0xffffff00ffffffff;
          uVar17 = 0;
          local_84 = internal_params.orientation ^ FT_ORIENTATION_FILL_LEFT;
          pSVar14 = (SDF_Contour *)0x0;
          local_60 = uVar24;
          do {
            pvVar8 = local_90;
            pSVar5 = *ppSVar33;
            local_48 = (FT_Bitmap *)(uVar17 * 0x28 + (long)local_90);
            local_98 = uVar17;
            local_50 = pSVar14;
            FT_Bitmap_Init(local_48);
            uVar6 = *(undefined8 *)local_80;
            *(undefined8 *)((long)pvVar8 + uVar17 * 0x28) = uVar6;
            uVar3 = local_80[2];
            *(uint *)((long)pvVar8 + uVar17 * 0x28 + 8) = uVar3;
            *(short *)((long)pvVar8 + uVar17 * 0x28 + 0x18) = (short)local_80[6];
            *(undefined1 *)((long)pvVar8 + uVar17 * 0x28 + 0x1a) =
                 *(undefined1 *)((long)local_80 + 0x1a);
            pvVar12 = ft_mem_alloc(local_a0,(ulong)((int)uVar6 * uVar3),&local_a8);
            uVar24 = local_60;
            *(FT_Pointer *)((long)pvVar8 + uVar17 * 0x28 + 0x10) = pvVar12;
            if (local_a8 != 0) goto LAB_0023d9c6;
            iVar28 = 0;
            if ((pSVar5 != (SDF_Contour *)0x0) &&
               (pSVar13 = pSVar5->edges, iVar28 = 0, pSVar13 != (SDF_Edge *)0x0)) {
              iVar28 = 0;
              do {
                SVar4 = pSVar13->edge_type;
                if (SVar4 == SDF_EDGE_CUBIC) {
                  lVar25 = (pSVar13->control_a).x;
                  lVar18 = (pSVar13->control_a).y;
                  uVar23 = ((pSVar13->start_pos).y + lVar18) * (lVar25 - (pSVar13->start_pos).x);
                  uVar17 = uVar23 + 0x3f;
                  if (-1 < (long)uVar23) {
                    uVar17 = uVar23;
                  }
                  lVar16 = (pSVar13->control_b).x;
                  lVar22 = (pSVar13->control_b).y;
                  uVar29 = (lVar18 + lVar22) * (lVar16 - lVar25);
                  uVar23 = uVar29 + 0x3f;
                  if (-1 < (long)uVar29) {
                    uVar23 = uVar29;
                  }
                  iVar28 = (int)(uVar23 >> 6) + iVar28 + (int)(uVar17 >> 6);
                  lVar16 = (pSVar13->end_pos).x - lVar16;
                  lVar25 = 0x18;
                }
                else if (SVar4 == SDF_EDGE_CONIC) {
                  lVar16 = (pSVar13->control_a).x;
                  lVar22 = (pSVar13->control_a).y;
                  uVar23 = ((pSVar13->start_pos).y + lVar22) * (lVar16 - (pSVar13->start_pos).x);
                  uVar17 = uVar23 + 0x3f;
                  if (-1 < (long)uVar23) {
                    uVar17 = uVar23;
                  }
                  iVar28 = iVar28 + (int)(uVar17 >> 6);
                  lVar16 = (pSVar13->end_pos).x - lVar16;
                  lVar25 = 0x18;
                }
                else {
                  if (SVar4 != SDF_EDGE_LINE) {
                    iVar28 = 0;
                    goto LAB_0023dc19;
                  }
                  lVar22 = (pSVar13->end_pos).y;
                  lVar16 = (pSVar13->end_pos).x - (pSVar13->start_pos).x;
                  lVar25 = 8;
                }
                uVar23 = (lVar22 + *(long *)((long)&(pSVar13->start_pos).x + lVar25)) * lVar16;
                uVar17 = uVar23 + 0x3f;
                if (-1 < (long)uVar23) {
                  uVar17 = uVar23;
                }
                iVar28 = (int)(uVar17 >> 6) + iVar28;
                pSVar13 = pSVar13->next;
              } while (pSVar13 != (SDF_Edge_ *)0x0);
              iVar28 = (iVar28 < 1) + 1;
            }
LAB_0023dc19:
            *(int *)((long)pvVar11 + local_98 * 4) = iVar28;
            iVar19 = (int)local_60;
            pSVar7 = pSVar5->next;
            pSVar5->next = (SDF_Contour_ *)0x0;
            internal_params_00.overload_sign._0_1_ =
                 iVar28 == 1 && local_84 == FT_ORIENTATION_FILL_RIGHT || iVar28 == 2 && iVar19 == 0;
            internal_params_00.orientation = (undefined4)local_68;
            internal_params_00.flip_sign = local_68._4_1_;
            internal_params_00.flip_y = local_68._5_1_;
            internal_params_00._6_2_ = local_68._6_2_;
            internal_params_00.overload_sign._1_3_ = 0;
            local_40.contours = pSVar5;
            local_a8 = sdf_generate_subdivision(internal_params_00,&local_40,local_a4,local_48);
            if (local_a8 != 0) goto LAB_0023d9cb;
            ppSVar33 = &pSVar5->next;
            *ppSVar33 = pSVar7;
            (local_40.contours)->next = local_50;
            if (iVar19 == 1) {
              iVar28 = *(int *)((long)pvVar11 + local_98 * 4);
              if (iVar28 == 1) {
                uVar15 = 2;
              }
              else {
                if (iVar28 != 2) goto LAB_0023dca6;
                uVar15 = 1;
              }
              *(undefined4 *)((long)pvVar11 + local_98 * 4) = uVar15;
            }
LAB_0023dca6:
            uVar17 = local_98 + 1;
            pSVar14 = local_40.contours;
          } while (uVar17 != uVar30);
        }
        *local_70 = pSVar14;
        if (0 < (int)local_78) {
          lVar25 = *(long *)(local_80 + 4);
          uVar17 = 0;
          do {
            if (0 < (int)uVar2) {
              uVar23 = 0;
              do {
                lVar18 = uVar23 + uVar17 * uVar2;
                if (uVar9 == 0) {
                  bVar32 = 0;
                  bVar27 = 0xff;
                }
                else {
                  uVar29 = 0;
                  plVar20 = (long *)((long)local_90 + 0x10);
                  bVar26 = 0xff;
                  bVar31 = 0;
                  do {
                    bVar1 = *(byte *)(*plVar20 + lVar18);
                    bVar27 = bVar26;
                    bVar32 = bVar31;
                    if (*(int *)((long)pvVar11 + uVar29 * 4) == 1) {
                      bVar32 = bVar1;
                      if (bVar1 < bVar31) {
                        bVar32 = bVar31;
                      }
                    }
                    else {
                      bVar27 = bVar1;
                      if (bVar26 < bVar1) {
                        bVar27 = bVar26;
                      }
                    }
                    uVar29 = uVar29 + 1;
                    plVar20 = plVar20 + 5;
                    bVar26 = bVar27;
                    bVar31 = bVar32;
                  } while (uVar30 != uVar29);
                }
                if (bVar32 < bVar27) {
                  bVar27 = bVar32;
                }
                *(byte *)(lVar25 + lVar18) = bVar27 ^ -((uVar24 & 0xff00000000) != 0);
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar2);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != local_78);
        }
      }
LAB_0023d9c6:
      if (pvVar11 != (FT_Pointer)0x0) {
LAB_0023d9cb:
        ft_mem_free(local_a0,pvVar11);
      }
    }
    lVar25 = local_58;
    pvVar11 = local_90;
    memory = local_a0;
    FVar10 = local_a8;
    if (local_90 != (void *)0x0) {
      if (uVar30 == 0) {
        local_a8 = 0x61;
        FVar10 = local_a8;
      }
      else {
        lVar18 = 0;
        do {
          ft_mem_free(memory,*(void **)((long)pvVar11 + lVar18 + 0x10));
          *(undefined8 *)((long)pvVar11 + lVar18 + 0x10) = 0;
          lVar18 = lVar18 + 0x28;
        } while (lVar25 != lVar18);
        ft_mem_free(memory,pvVar11);
        FVar10 = local_a8;
      }
    }
  }
  return FVar10;
}

Assistant:

static FT_Error
  sdf_generate_with_overlaps( SDF_Params        internal_params,
                              SDF_Shape*        shape,
                              FT_UInt           spread,
                              const FT_Bitmap*  bitmap )
  {
    FT_Error  error = FT_Err_Ok;

    FT_Int      num_contours;        /* total number of contours      */
    FT_Int      i, j;                /* iterators                     */
    FT_Int      width, rows;         /* width and rows of the bitmap  */
    FT_Bitmap*  bitmaps;             /* separate bitmaps for contours */

    SDF_Contour*  contour;           /* temporary variable to iterate */
    SDF_Contour*  temp_contour;      /* temporary contour             */
    SDF_Contour*  head;              /* head of the contour list      */
    SDF_Shape     temp_shape;        /* temporary shape               */

    FT_Memory      memory;           /* to allocate memory            */
    FT_SDFFormat*  t;                /* target bitmap buffer          */
    FT_Bool        flip_sign;        /* flip sign?                    */

    /* orientation of all the separate contours */
    SDF_Contour_Orientation*  orientations;


    bitmaps      = NULL;
    orientations = NULL;
    head         = NULL;

    if ( !shape || !bitmap || !shape->memory )
      return FT_THROW( Invalid_Argument );

    /* Disable `flip_sign` to avoid extra complication */
    /* during the combination phase.                   */
    flip_sign                 = internal_params.flip_sign;
    internal_params.flip_sign = 0;

    contour           = shape->contours;
    memory            = shape->memory;
    temp_shape.memory = memory;
    width             = (FT_Int)bitmap->width;
    rows              = (FT_Int)bitmap->rows;
    num_contours      = 0;

    /* find the number of contours in the shape */
    while ( contour )
    {
      num_contours++;
      contour = contour->next;
    }

    /* allocate the bitmaps to generate SDF for separate contours */
    if ( FT_ALLOC( bitmaps,
                   (FT_UInt)num_contours * sizeof ( *bitmaps ) ) )
      goto Exit;

    /* allocate array to hold orientation for all contours */
    if ( FT_ALLOC( orientations,
                   (FT_UInt)num_contours * sizeof ( *orientations ) ) )
      goto Exit;

    contour = shape->contours;

    /* Iterate over all contours and generate SDF separately. */
    for ( i = 0; i < num_contours; i++ )
    {
      /* initialize the corresponding bitmap */
      FT_Bitmap_Init( &bitmaps[i] );

      bitmaps[i].width      = bitmap->width;
      bitmaps[i].rows       = bitmap->rows;
      bitmaps[i].pitch      = bitmap->pitch;
      bitmaps[i].num_grays  = bitmap->num_grays;
      bitmaps[i].pixel_mode = bitmap->pixel_mode;

      /* allocate memory for the buffer */
      if ( FT_ALLOC( bitmaps[i].buffer,
                     bitmap->rows * (FT_UInt)bitmap->pitch ) )
        goto Exit;

      /* determine the orientation */
      orientations[i] = get_contour_orientation( contour );

      /* The `overload_sign` property is specific to  */
      /* `sdf_generate_bounding_box`.  This basically */
      /* overloads the default sign of the outside    */
      /* pixels, which is necessary for               */
      /* counter-clockwise contours.                  */
      if ( orientations[i] == SDF_ORIENTATION_CCW                   &&
           internal_params.orientation == FT_ORIENTATION_FILL_RIGHT )
        internal_params.overload_sign = 1;
      else if ( orientations[i] == SDF_ORIENTATION_CW                   &&
                internal_params.orientation == FT_ORIENTATION_FILL_LEFT )
        internal_params.overload_sign = 1;
      else
        internal_params.overload_sign = 0;

      /* Make `contour->next` NULL so that there is   */
      /* one contour in the list.  Also hold the next */
      /* contour in a temporary variable so as to     */
      /* restore the original value.                  */
      temp_contour  = contour->next;
      contour->next = NULL;

      /* Use `temp_shape` to hold the new contour. */
      /* Now, `temp_shape` has only one contour.   */
      temp_shape.contours = contour;

      /* finally generate the SDF */
      FT_CALL( sdf_generate_subdivision( internal_params,
                                         &temp_shape,
                                         spread,
                                         &bitmaps[i] ) );

      /* Restore the original `next` variable. */
      contour->next = temp_contour;

      /* Since `split_sdf_shape` deallocated the original */
      /* contours list we need to assign the new value to */
      /* the shape's contour.                             */
      temp_shape.contours->next = head;
      head                      = temp_shape.contours;

      /* Simply flip the orientation in case of post-script fonts */
      /* so as to avoid modificatons in the combining phase.      */
      if ( internal_params.orientation == FT_ORIENTATION_FILL_LEFT )
      {
        if ( orientations[i] == SDF_ORIENTATION_CW )
          orientations[i] = SDF_ORIENTATION_CCW;
        else if ( orientations[i] == SDF_ORIENTATION_CCW )
          orientations[i] = SDF_ORIENTATION_CW;
      }

      contour = contour->next;
    }

    /* assign the new contour list to `shape->contours` */
    shape->contours = head;

    /* cast the output bitmap buffer */
    t = (FT_SDFFormat*)bitmap->buffer;

    /* Iterate over all pixels and combine all separate    */
    /* contours.  These are the rules for combining:       */
    /*                                                     */
    /* (1) For all clockwise contours, compute the largest */
    /*     value.  Name this as `val_c`.                   */
    /* (2) For all counter-clockwise contours, compute the */
    /*     smallest value.  Name this as `val_ac`.         */
    /* (3) Now, finally use the smaller value of `val_c'   */
    /*     and `val_ac'.                                   */
    for ( j = 0; j < rows; j++ )
    {
      for ( i = 0; i < width; i++ )
      {
        FT_Int  id = j * width + i;       /* index of current pixel    */
        FT_Int  c;                        /* contour iterator          */

        FT_SDFFormat  val_c  = 0;         /* max clockwise value       */
        FT_SDFFormat  val_ac = UCHAR_MAX; /* min counter-clockwise val */


        /* iterate through all the contours */
        for ( c = 0; c < num_contours; c++ )
        {
          /* current contour value */
          FT_SDFFormat  temp = ( (FT_SDFFormat*)bitmaps[c].buffer )[id];


          if ( orientations[c] == SDF_ORIENTATION_CW )
            val_c = FT_MAX( val_c, temp );   /* clockwise         */
          else
            val_ac = FT_MIN( val_ac, temp ); /* counter-clockwise */
        }

        /* Finally find the smaller of the two and assign to output. */
        /* Also apply `flip_sign` if set.                            */
        t[id] = FT_MIN( val_c, val_ac );

        if ( flip_sign )
          t[id] = invert_sign( t[id] );
      }
    }

  Exit:
    /* deallocate orientations array */
    if ( orientations )
      FT_FREE( orientations );

    /* deallocate temporary bitmaps */
    if ( bitmaps )
    {
      if ( num_contours == 0 )
        error = FT_THROW( Raster_Corrupted );
      else
      {
        for ( i = 0; i < num_contours; i++ )
          FT_FREE( bitmaps[i].buffer );

        FT_FREE( bitmaps );
      }
    }

    /* restore the `flip_sign` property */
    internal_params.flip_sign = flip_sign;

    return error;
  }